

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btQuantizedBvh.cpp
# Opt level: O2

bool __thiscall
btQuantizedBvh::serialize
          (btQuantizedBvh *this,void *o_alignedDataBuffer,uint param_2,bool i_swapEndian)

{
  void *buffer;
  undefined8 *puVar1;
  undefined8 *puVar2;
  bool bVar3;
  ushort uVar4;
  uint uVar5;
  btQuantizedBvhNode *pbVar6;
  btOptimizedBvhNode *pbVar7;
  btBvhSubtreeInfo *pbVar8;
  long lVar9;
  undefined8 uVar10;
  btTraversalMode bVar11;
  ulong uVar12;
  uint uVar13;
  undefined7 in_register_00000009;
  long lVar14;
  ulong uVar15;
  long lVar16;
  
  this->m_subtreeHeaderCount = (this->m_SubtreeHeaders).m_size;
  btQuantizedBvh((btQuantizedBvh *)o_alignedDataBuffer);
  uVar13 = this->m_curNodeIndex;
  if ((int)CONCAT71(in_register_00000009,i_swapEndian) == 0) {
    *(uint *)((long)o_alignedDataBuffer + 0x3c) = uVar13;
    uVar10 = *(undefined8 *)((this->m_bvhAabbMin).m_floats + 2);
    *(undefined8 *)((long)o_alignedDataBuffer + 8) = *(undefined8 *)(this->m_bvhAabbMin).m_floats;
    *(undefined8 *)((long)o_alignedDataBuffer + 0x10) = uVar10;
    uVar10 = *(undefined8 *)((this->m_bvhAabbMax).m_floats + 2);
    *(undefined8 *)((long)o_alignedDataBuffer + 0x18) = *(undefined8 *)(this->m_bvhAabbMax).m_floats
    ;
    *(undefined8 *)((long)o_alignedDataBuffer + 0x20) = uVar10;
    uVar10 = *(undefined8 *)((this->m_bvhQuantization).m_floats + 2);
    *(undefined8 *)((long)o_alignedDataBuffer + 0x28) =
         *(undefined8 *)(this->m_bvhQuantization).m_floats;
    *(undefined8 *)((long)o_alignedDataBuffer + 0x30) = uVar10;
    bVar11 = this->m_traversalMode;
    uVar13 = this->m_subtreeHeaderCount;
  }
  else {
    *(uint *)((long)o_alignedDataBuffer + 0x3c) =
         uVar13 >> 0x18 | (uVar13 & 0xff0000) >> 8 | (uVar13 & 0xff00) << 8 | uVar13 << 0x18;
    btSwapVector3Endian(&this->m_bvhAabbMin,(btVector3 *)((long)o_alignedDataBuffer + 8));
    btSwapVector3Endian(&this->m_bvhAabbMax,(btVector3 *)((long)o_alignedDataBuffer + 0x18));
    btSwapVector3Endian(&this->m_bvhQuantization,(btVector3 *)((long)o_alignedDataBuffer + 0x28));
    bVar11 = this->m_traversalMode;
    uVar13 = this->m_subtreeHeaderCount;
    bVar11 = bVar11 >> 0x18 | (bVar11 & 0xff0000) >> 8 | (bVar11 & 0xff00) << 8 | bVar11 << 0x18;
    uVar13 = uVar13 >> 0x18 | (uVar13 & 0xff0000) >> 8 | (uVar13 & 0xff00) << 8 | uVar13 << 0x18;
  }
  *(btTraversalMode *)((long)o_alignedDataBuffer + 200) = bVar11;
  *(uint *)((long)o_alignedDataBuffer + 0xf0) = uVar13;
  bVar3 = this->m_useQuantization;
  *(bool *)((long)o_alignedDataBuffer + 0x40) = bVar3;
  buffer = (void *)((long)o_alignedDataBuffer + 0xf8);
  uVar13 = this->m_curNodeIndex;
  if (bVar3 == true) {
    btAlignedObjectArray<btQuantizedBvhNode>::initializeFromBuffer
              ((btAlignedObjectArray<btQuantizedBvhNode> *)((long)o_alignedDataBuffer + 0xa8),buffer
               ,uVar13,uVar13);
    pbVar6 = (this->m_quantizedContiguousNodes).m_data;
    uVar12 = 0;
    if (0 < (int)uVar13) {
      uVar12 = (ulong)uVar13;
    }
    lVar14 = 0;
    if (i_swapEndian) {
      for (; uVar12 * 0x10 != lVar14; lVar14 = lVar14 + 0x10) {
        uVar4 = *(ushort *)((long)pbVar6->m_quantizedAabbMin + lVar14);
        lVar16 = *(long *)((long)o_alignedDataBuffer + 0xb8);
        *(ushort *)(lVar16 + lVar14) = uVar4 << 8 | uVar4 >> 8;
        uVar4 = *(ushort *)((long)pbVar6->m_quantizedAabbMin + lVar14 + 2);
        *(ushort *)(lVar16 + 2 + lVar14) = uVar4 << 8 | uVar4 >> 8;
        uVar4 = *(ushort *)((long)pbVar6->m_quantizedAabbMin + lVar14 + 4);
        *(ushort *)(lVar16 + 4 + lVar14) = uVar4 << 8 | uVar4 >> 8;
        uVar4 = *(ushort *)((long)pbVar6->m_quantizedAabbMax + lVar14);
        *(ushort *)(lVar16 + 6 + lVar14) = uVar4 << 8 | uVar4 >> 8;
        uVar4 = *(ushort *)((long)pbVar6->m_quantizedAabbMax + lVar14 + 2);
        *(ushort *)(lVar16 + 8 + lVar14) = uVar4 << 8 | uVar4 >> 8;
        uVar4 = *(ushort *)((long)pbVar6->m_quantizedAabbMax + lVar14 + 4);
        *(ushort *)(lVar16 + 10 + lVar14) = uVar4 << 8 | uVar4 >> 8;
        uVar5 = *(uint *)((long)pbVar6->m_quantizedAabbMax + lVar14 + 6);
        *(uint *)(lVar16 + 0xc + lVar14) =
             uVar5 >> 0x18 | (uVar5 & 0xff0000) >> 8 | (uVar5 & 0xff00) << 8 | uVar5 << 0x18;
      }
    }
    else {
      for (; uVar12 * 0x10 != lVar14; lVar14 = lVar14 + 0x10) {
        lVar16 = *(long *)((long)o_alignedDataBuffer + 0xb8);
        *(undefined2 *)(lVar16 + lVar14) =
             *(undefined2 *)((long)pbVar6->m_quantizedAabbMin + lVar14);
        *(undefined2 *)(lVar16 + 2 + lVar14) =
             *(undefined2 *)((long)pbVar6->m_quantizedAabbMin + lVar14 + 2);
        *(undefined2 *)(lVar16 + 4 + lVar14) =
             *(undefined2 *)((long)pbVar6->m_quantizedAabbMin + lVar14 + 4);
        *(undefined2 *)(lVar16 + 6 + lVar14) =
             *(undefined2 *)((long)pbVar6->m_quantizedAabbMax + lVar14);
        *(undefined2 *)(lVar16 + 8 + lVar14) =
             *(undefined2 *)((long)pbVar6->m_quantizedAabbMax + lVar14 + 2);
        *(undefined2 *)(lVar16 + 10 + lVar14) =
             *(undefined2 *)((long)pbVar6->m_quantizedAabbMax + lVar14 + 4);
        *(undefined4 *)(lVar16 + 0xc + lVar14) =
             *(undefined4 *)((long)pbVar6->m_quantizedAabbMax + lVar14 + 6);
      }
    }
    lVar14 = (long)(int)uVar13 << 4;
    btAlignedObjectArray<btQuantizedBvhNode>::initializeFromBuffer
              ((btAlignedObjectArray<btQuantizedBvhNode> *)((long)o_alignedDataBuffer + 0xa8),
               (void *)0x0,0,0);
  }
  else {
    btAlignedObjectArray<btOptimizedBvhNode>::initializeFromBuffer
              ((btAlignedObjectArray<btOptimizedBvhNode> *)((long)o_alignedDataBuffer + 0x68),buffer
               ,uVar13,uVar13);
    uVar12 = 0;
    if (0 < (int)uVar13) {
      uVar12 = (ulong)uVar13;
    }
    if (i_swapEndian) {
      for (lVar14 = 0; uVar12 * 0x40 != lVar14; lVar14 = lVar14 + 0x40) {
        btSwapVector3Endian((btVector3 *)
                            ((long)(((this->m_contiguousNodes).m_data)->m_aabbMinOrg).m_floats +
                            lVar14),(btVector3 *)
                                    (*(long *)((long)o_alignedDataBuffer + 0x78) + lVar14));
        btSwapVector3Endian((btVector3 *)
                            ((long)(((this->m_contiguousNodes).m_data)->m_aabbMaxOrg).m_floats +
                            lVar14),(btVector3 *)
                                    (*(long *)((long)o_alignedDataBuffer + 0x78) + lVar14 + 0x10));
        pbVar7 = (this->m_contiguousNodes).m_data;
        uVar5 = *(uint *)(pbVar7->m_padding + lVar14 + -0xc);
        lVar16 = *(long *)((long)o_alignedDataBuffer + 0x78);
        *(uint *)(lVar16 + 0x20 + lVar14) =
             uVar5 >> 0x18 | (uVar5 & 0xff0000) >> 8 | (uVar5 & 0xff00) << 8 | uVar5 << 0x18;
        uVar5 = *(uint *)(pbVar7->m_padding + lVar14 + -8);
        *(uint *)(lVar16 + 0x24 + lVar14) =
             uVar5 >> 0x18 | (uVar5 & 0xff0000) >> 8 | (uVar5 & 0xff00) << 8 | uVar5 << 0x18;
        uVar5 = *(uint *)(pbVar7->m_padding + lVar14 + -4);
        *(uint *)(lVar16 + 0x28 + lVar14) =
             uVar5 >> 0x18 | (uVar5 & 0xff0000) >> 8 | (uVar5 & 0xff00) << 8 | uVar5 << 0x18;
      }
    }
    else {
      for (lVar14 = 0; uVar12 * 0x40 != lVar14; lVar14 = lVar14 + 0x40) {
        puVar1 = (undefined8 *)
                 ((long)(((this->m_contiguousNodes).m_data)->m_aabbMinOrg).m_floats + lVar14);
        uVar10 = puVar1[1];
        puVar2 = (undefined8 *)(*(long *)((long)o_alignedDataBuffer + 0x78) + lVar14);
        *puVar2 = *puVar1;
        puVar2[1] = uVar10;
        puVar1 = (undefined8 *)
                 ((long)(((this->m_contiguousNodes).m_data)->m_aabbMaxOrg).m_floats + lVar14);
        uVar10 = puVar1[1];
        puVar2 = (undefined8 *)(*(long *)((long)o_alignedDataBuffer + 0x78) + 0x10 + lVar14);
        *puVar2 = *puVar1;
        puVar2[1] = uVar10;
        pbVar7 = (this->m_contiguousNodes).m_data;
        lVar16 = *(long *)((long)o_alignedDataBuffer + 0x78);
        *(undefined8 *)(lVar16 + 0x20 + lVar14) = *(undefined8 *)(pbVar7->m_padding + lVar14 + -0xc)
        ;
        *(undefined4 *)(lVar16 + 0x28 + lVar14) = *(undefined4 *)(pbVar7->m_padding + lVar14 + -4);
      }
    }
    lVar14 = (long)(int)uVar13 << 6;
    btAlignedObjectArray<btOptimizedBvhNode>::initializeFromBuffer
              ((btAlignedObjectArray<btOptimizedBvhNode> *)((long)o_alignedDataBuffer + 0x68),
               (void *)0x0,0,0);
  }
  btAlignedObjectArray<btBvhSubtreeInfo>::initializeFromBuffer
            ((btAlignedObjectArray<btBvhSubtreeInfo> *)((long)o_alignedDataBuffer + 0xd0),
             (void *)((long)buffer + lVar14),this->m_subtreeHeaderCount,this->m_subtreeHeaderCount);
  if (i_swapEndian) {
    pbVar8 = (this->m_SubtreeHeaders).m_data;
    uVar15 = 0;
    uVar12 = (ulong)(uint)this->m_subtreeHeaderCount;
    if (this->m_subtreeHeaderCount < 1) {
      uVar12 = uVar15;
    }
    for (; uVar12 * 0x20 != uVar15; uVar15 = uVar15 + 0x20) {
      uVar4 = *(ushort *)((long)pbVar8->m_quantizedAabbMin + uVar15);
      lVar14 = *(long *)((long)o_alignedDataBuffer + 0xe0);
      *(ushort *)(lVar14 + uVar15) = uVar4 << 8 | uVar4 >> 8;
      uVar4 = *(ushort *)((long)pbVar8->m_quantizedAabbMin + uVar15 + 2);
      *(ushort *)(lVar14 + 2 + uVar15) = uVar4 << 8 | uVar4 >> 8;
      uVar4 = *(ushort *)((long)pbVar8->m_quantizedAabbMin + uVar15 + 4);
      *(ushort *)(lVar14 + 4 + uVar15) = uVar4 << 8 | uVar4 >> 8;
      uVar4 = *(ushort *)((long)pbVar8->m_quantizedAabbMax + uVar15);
      *(ushort *)(lVar14 + 6 + uVar15) = uVar4 << 8 | uVar4 >> 8;
      uVar4 = *(ushort *)((long)pbVar8->m_quantizedAabbMax + uVar15 + 2);
      *(ushort *)(lVar14 + 8 + uVar15) = uVar4 << 8 | uVar4 >> 8;
      uVar4 = *(ushort *)((long)pbVar8->m_quantizedAabbMax + uVar15 + 4);
      *(ushort *)(lVar14 + 10 + uVar15) = uVar4 << 8 | uVar4 >> 8;
      uVar13 = *(uint *)((long)pbVar8->m_quantizedAabbMax + uVar15 + 6);
      *(uint *)(lVar14 + 0xc + uVar15) =
           uVar13 >> 0x18 | (uVar13 & 0xff0000) >> 8 | (uVar13 & 0xff00) << 8 | uVar13 << 0x18;
      uVar13 = *(uint *)((long)pbVar8->m_padding + (uVar15 - 4));
      *(uint *)(lVar14 + 0x10 + uVar15) =
           uVar13 >> 0x18 | (uVar13 & 0xff0000) >> 8 | (uVar13 & 0xff00) << 8 | uVar13 << 0x18;
    }
  }
  else {
    pbVar8 = (this->m_SubtreeHeaders).m_data;
    lVar14 = 0;
    for (lVar16 = 0; lVar16 < this->m_subtreeHeaderCount; lVar16 = lVar16 + 1) {
      lVar9 = *(long *)((long)o_alignedDataBuffer + 0xe0);
      *(undefined2 *)(lVar9 + lVar14) = *(undefined2 *)((long)pbVar8->m_quantizedAabbMin + lVar14);
      *(undefined2 *)(lVar9 + 2 + lVar14) =
           *(undefined2 *)((long)pbVar8->m_quantizedAabbMin + lVar14 + 2);
      *(undefined2 *)(lVar9 + 4 + lVar14) =
           *(undefined2 *)((long)pbVar8->m_quantizedAabbMin + lVar14 + 4);
      *(undefined2 *)(lVar9 + 6 + lVar14) =
           *(undefined2 *)((long)pbVar8->m_quantizedAabbMax + lVar14);
      *(undefined2 *)(lVar9 + 8 + lVar14) =
           *(undefined2 *)((long)pbVar8->m_quantizedAabbMax + lVar14 + 2);
      *(undefined2 *)(lVar9 + 10 + lVar14) =
           *(undefined2 *)((long)pbVar8->m_quantizedAabbMax + lVar14 + 4);
      *(undefined8 *)(lVar9 + 0xc + lVar14) =
           *(undefined8 *)((long)pbVar8->m_quantizedAabbMax + lVar14 + 6);
      *(undefined8 *)(lVar9 + 0x14 + lVar14) = 0;
      *(undefined4 *)(lVar9 + 0x1c + lVar14) = 0;
      lVar14 = lVar14 + 0x20;
    }
  }
  btAlignedObjectArray<btBvhSubtreeInfo>::initializeFromBuffer
            ((btAlignedObjectArray<btBvhSubtreeInfo> *)((long)o_alignedDataBuffer + 0xd0),
             (void *)0x0,0,0);
  *(undefined8 *)o_alignedDataBuffer = 0;
  return true;
}

Assistant:

bool btQuantizedBvh::serialize(void *o_alignedDataBuffer, unsigned /*i_dataBufferSize */, bool i_swapEndian) const
{
	btAssert(m_subtreeHeaderCount == m_SubtreeHeaders.size());
	m_subtreeHeaderCount = m_SubtreeHeaders.size();

/*	if (i_dataBufferSize < calculateSerializeBufferSize() || o_alignedDataBuffer == NULL || (((unsigned)o_alignedDataBuffer & BVH_ALIGNMENT_MASK) != 0))
	{
		///check alignedment for buffer?
		btAssert(0);
		return false;
	}
*/

	btQuantizedBvh *targetBvh = (btQuantizedBvh *)o_alignedDataBuffer;

	// construct the class so the virtual function table, etc will be set up
	// Also, m_leafNodes and m_quantizedLeafNodes will be initialized to default values by the constructor
	new (targetBvh) btQuantizedBvh;

	if (i_swapEndian)
	{
		targetBvh->m_curNodeIndex = static_cast<int>(btSwapEndian(m_curNodeIndex));


		btSwapVector3Endian(m_bvhAabbMin,targetBvh->m_bvhAabbMin);
		btSwapVector3Endian(m_bvhAabbMax,targetBvh->m_bvhAabbMax);
		btSwapVector3Endian(m_bvhQuantization,targetBvh->m_bvhQuantization);

		targetBvh->m_traversalMode = (btTraversalMode)btSwapEndian(m_traversalMode);
		targetBvh->m_subtreeHeaderCount = static_cast<int>(btSwapEndian(m_subtreeHeaderCount));
	}
	else
	{
		targetBvh->m_curNodeIndex = m_curNodeIndex;
		targetBvh->m_bvhAabbMin = m_bvhAabbMin;
		targetBvh->m_bvhAabbMax = m_bvhAabbMax;
		targetBvh->m_bvhQuantization = m_bvhQuantization;
		targetBvh->m_traversalMode = m_traversalMode;
		targetBvh->m_subtreeHeaderCount = m_subtreeHeaderCount;
	}

	targetBvh->m_useQuantization = m_useQuantization;

	unsigned char *nodeData = (unsigned char *)targetBvh;
	nodeData += sizeof(btQuantizedBvh);
	
	unsigned sizeToAdd = 0;//(BVH_ALIGNMENT-((unsigned)nodeData & BVH_ALIGNMENT_MASK))&BVH_ALIGNMENT_MASK;
	nodeData += sizeToAdd;
	
	int nodeCount = m_curNodeIndex;

	if (m_useQuantization)
	{
		targetBvh->m_quantizedContiguousNodes.initializeFromBuffer(nodeData, nodeCount, nodeCount);

		if (i_swapEndian)
		{
			for (int nodeIndex = 0; nodeIndex < nodeCount; nodeIndex++)
			{
				targetBvh->m_quantizedContiguousNodes[nodeIndex].m_quantizedAabbMin[0] = btSwapEndian(m_quantizedContiguousNodes[nodeIndex].m_quantizedAabbMin[0]);
				targetBvh->m_quantizedContiguousNodes[nodeIndex].m_quantizedAabbMin[1] = btSwapEndian(m_quantizedContiguousNodes[nodeIndex].m_quantizedAabbMin[1]);
				targetBvh->m_quantizedContiguousNodes[nodeIndex].m_quantizedAabbMin[2] = btSwapEndian(m_quantizedContiguousNodes[nodeIndex].m_quantizedAabbMin[2]);

				targetBvh->m_quantizedContiguousNodes[nodeIndex].m_quantizedAabbMax[0] = btSwapEndian(m_quantizedContiguousNodes[nodeIndex].m_quantizedAabbMax[0]);
				targetBvh->m_quantizedContiguousNodes[nodeIndex].m_quantizedAabbMax[1] = btSwapEndian(m_quantizedContiguousNodes[nodeIndex].m_quantizedAabbMax[1]);
				targetBvh->m_quantizedContiguousNodes[nodeIndex].m_quantizedAabbMax[2] = btSwapEndian(m_quantizedContiguousNodes[nodeIndex].m_quantizedAabbMax[2]);

				targetBvh->m_quantizedContiguousNodes[nodeIndex].m_escapeIndexOrTriangleIndex = static_cast<int>(btSwapEndian(m_quantizedContiguousNodes[nodeIndex].m_escapeIndexOrTriangleIndex));
			}
		}
		else
		{
			for (int nodeIndex = 0; nodeIndex < nodeCount; nodeIndex++)
			{
	
				targetBvh->m_quantizedContiguousNodes[nodeIndex].m_quantizedAabbMin[0] = m_quantizedContiguousNodes[nodeIndex].m_quantizedAabbMin[0];
				targetBvh->m_quantizedContiguousNodes[nodeIndex].m_quantizedAabbMin[1] = m_quantizedContiguousNodes[nodeIndex].m_quantizedAabbMin[1];
				targetBvh->m_quantizedContiguousNodes[nodeIndex].m_quantizedAabbMin[2] = m_quantizedContiguousNodes[nodeIndex].m_quantizedAabbMin[2];

				targetBvh->m_quantizedContiguousNodes[nodeIndex].m_quantizedAabbMax[0] = m_quantizedContiguousNodes[nodeIndex].m_quantizedAabbMax[0];
				targetBvh->m_quantizedContiguousNodes[nodeIndex].m_quantizedAabbMax[1] = m_quantizedContiguousNodes[nodeIndex].m_quantizedAabbMax[1];
				targetBvh->m_quantizedContiguousNodes[nodeIndex].m_quantizedAabbMax[2] = m_quantizedContiguousNodes[nodeIndex].m_quantizedAabbMax[2];

				targetBvh->m_quantizedContiguousNodes[nodeIndex].m_escapeIndexOrTriangleIndex = m_quantizedContiguousNodes[nodeIndex].m_escapeIndexOrTriangleIndex;


			}
		}
		nodeData += sizeof(btQuantizedBvhNode) * nodeCount;

		// this clears the pointer in the member variable it doesn't really do anything to the data
		// it does call the destructor on the contained objects, but they are all classes with no destructor defined
		// so the memory (which is not freed) is left alone
		targetBvh->m_quantizedContiguousNodes.initializeFromBuffer(NULL, 0, 0);
	}
	else
	{
		targetBvh->m_contiguousNodes.initializeFromBuffer(nodeData, nodeCount, nodeCount);

		if (i_swapEndian)
		{
			for (int nodeIndex = 0; nodeIndex < nodeCount; nodeIndex++)
			{
				btSwapVector3Endian(m_contiguousNodes[nodeIndex].m_aabbMinOrg, targetBvh->m_contiguousNodes[nodeIndex].m_aabbMinOrg);
				btSwapVector3Endian(m_contiguousNodes[nodeIndex].m_aabbMaxOrg, targetBvh->m_contiguousNodes[nodeIndex].m_aabbMaxOrg);

				targetBvh->m_contiguousNodes[nodeIndex].m_escapeIndex = static_cast<int>(btSwapEndian(m_contiguousNodes[nodeIndex].m_escapeIndex));
				targetBvh->m_contiguousNodes[nodeIndex].m_subPart = static_cast<int>(btSwapEndian(m_contiguousNodes[nodeIndex].m_subPart));
				targetBvh->m_contiguousNodes[nodeIndex].m_triangleIndex = static_cast<int>(btSwapEndian(m_contiguousNodes[nodeIndex].m_triangleIndex));
			}
		}
		else
		{
			for (int nodeIndex = 0; nodeIndex < nodeCount; nodeIndex++)
			{
				targetBvh->m_contiguousNodes[nodeIndex].m_aabbMinOrg = m_contiguousNodes[nodeIndex].m_aabbMinOrg;
				targetBvh->m_contiguousNodes[nodeIndex].m_aabbMaxOrg = m_contiguousNodes[nodeIndex].m_aabbMaxOrg;

				targetBvh->m_contiguousNodes[nodeIndex].m_escapeIndex = m_contiguousNodes[nodeIndex].m_escapeIndex;
				targetBvh->m_contiguousNodes[nodeIndex].m_subPart = m_contiguousNodes[nodeIndex].m_subPart;
				targetBvh->m_contiguousNodes[nodeIndex].m_triangleIndex = m_contiguousNodes[nodeIndex].m_triangleIndex;
			}
		}
		nodeData += sizeof(btOptimizedBvhNode) * nodeCount;

		// this clears the pointer in the member variable it doesn't really do anything to the data
		// it does call the destructor on the contained objects, but they are all classes with no destructor defined
		// so the memory (which is not freed) is left alone
		targetBvh->m_contiguousNodes.initializeFromBuffer(NULL, 0, 0);
	}

	sizeToAdd = 0;//(BVH_ALIGNMENT-((unsigned)nodeData & BVH_ALIGNMENT_MASK))&BVH_ALIGNMENT_MASK;
	nodeData += sizeToAdd;

	// Now serialize the subtree headers
	targetBvh->m_SubtreeHeaders.initializeFromBuffer(nodeData, m_subtreeHeaderCount, m_subtreeHeaderCount);
	if (i_swapEndian)
	{
		for (int i = 0; i < m_subtreeHeaderCount; i++)
		{
			targetBvh->m_SubtreeHeaders[i].m_quantizedAabbMin[0] = btSwapEndian(m_SubtreeHeaders[i].m_quantizedAabbMin[0]);
			targetBvh->m_SubtreeHeaders[i].m_quantizedAabbMin[1] = btSwapEndian(m_SubtreeHeaders[i].m_quantizedAabbMin[1]);
			targetBvh->m_SubtreeHeaders[i].m_quantizedAabbMin[2] = btSwapEndian(m_SubtreeHeaders[i].m_quantizedAabbMin[2]);

			targetBvh->m_SubtreeHeaders[i].m_quantizedAabbMax[0] = btSwapEndian(m_SubtreeHeaders[i].m_quantizedAabbMax[0]);
			targetBvh->m_SubtreeHeaders[i].m_quantizedAabbMax[1] = btSwapEndian(m_SubtreeHeaders[i].m_quantizedAabbMax[1]);
			targetBvh->m_SubtreeHeaders[i].m_quantizedAabbMax[2] = btSwapEndian(m_SubtreeHeaders[i].m_quantizedAabbMax[2]);

			targetBvh->m_SubtreeHeaders[i].m_rootNodeIndex = static_cast<int>(btSwapEndian(m_SubtreeHeaders[i].m_rootNodeIndex));
			targetBvh->m_SubtreeHeaders[i].m_subtreeSize = static_cast<int>(btSwapEndian(m_SubtreeHeaders[i].m_subtreeSize));
		}
	}
	else
	{
		for (int i = 0; i < m_subtreeHeaderCount; i++)
		{
			targetBvh->m_SubtreeHeaders[i].m_quantizedAabbMin[0] = (m_SubtreeHeaders[i].m_quantizedAabbMin[0]);
			targetBvh->m_SubtreeHeaders[i].m_quantizedAabbMin[1] = (m_SubtreeHeaders[i].m_quantizedAabbMin[1]);
			targetBvh->m_SubtreeHeaders[i].m_quantizedAabbMin[2] = (m_SubtreeHeaders[i].m_quantizedAabbMin[2]);

			targetBvh->m_SubtreeHeaders[i].m_quantizedAabbMax[0] = (m_SubtreeHeaders[i].m_quantizedAabbMax[0]);
			targetBvh->m_SubtreeHeaders[i].m_quantizedAabbMax[1] = (m_SubtreeHeaders[i].m_quantizedAabbMax[1]);
			targetBvh->m_SubtreeHeaders[i].m_quantizedAabbMax[2] = (m_SubtreeHeaders[i].m_quantizedAabbMax[2]);

			targetBvh->m_SubtreeHeaders[i].m_rootNodeIndex = (m_SubtreeHeaders[i].m_rootNodeIndex);
			targetBvh->m_SubtreeHeaders[i].m_subtreeSize = (m_SubtreeHeaders[i].m_subtreeSize);

			// need to clear padding in destination buffer
			targetBvh->m_SubtreeHeaders[i].m_padding[0] = 0;
			targetBvh->m_SubtreeHeaders[i].m_padding[1] = 0;
			targetBvh->m_SubtreeHeaders[i].m_padding[2] = 0;
		}
	}
	nodeData += sizeof(btBvhSubtreeInfo) * m_subtreeHeaderCount;

	// this clears the pointer in the member variable it doesn't really do anything to the data
	// it does call the destructor on the contained objects, but they are all classes with no destructor defined
	// so the memory (which is not freed) is left alone
	targetBvh->m_SubtreeHeaders.initializeFromBuffer(NULL, 0, 0);

	// this wipes the virtual function table pointer at the start of the buffer for the class
	*((void**)o_alignedDataBuffer) = NULL;

	return true;
}